

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_fourier_transform_cepstral_analysis.h
# Opt level: O2

void __thiscall sptk::FastFourierTransformCepstralAnalysis::Buffer::~Buffer(Buffer *this)

{
  this->_vptr_Buffer = (_func_int **)&PTR__Buffer_00115780;
  RealValuedInverseFastFourierTransform::Buffer::~Buffer
            (&this->buffer_for_inverse_fast_fourier_transform_);
  RealValuedFastFourierTransform::Buffer::~Buffer(&this->buffer_for_fast_fourier_transform_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->imag_part_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->real_part_).super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

virtual ~Buffer() {
    }